

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O0

Vec_Int_t *
Acb_DerivePatchSupport
          (Cnf_Dat_t *pCnf,int iTar,int nTargets,int nCoDivs,Vec_Int_t *vDivs,Acb_Ntk_t *pNtkF,
          Vec_Int_t *vSuppOld,int TimeOut)

{
  Cnf_Dat_t *pCVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  sat_solver *s;
  abctime aVar6;
  abctime aVar7;
  int *piVar8;
  int *end;
  Vec_Int_t *vWeights_00;
  int nFinal;
  int *pFinal;
  Vec_Int_t *vWeights;
  Vec_Int_t *vTemp;
  abctime clk_2;
  abctime clk_1;
  int iVar1;
  int iVar0;
  int iDivOld;
  int j;
  int pLits [2];
  int iDivVar;
  int status;
  int nSuppNew;
  int iLit;
  int fUseMinAssump;
  abctime clk;
  sat_solver *pSat;
  int iCiVarBeg;
  int iCoVarBeg;
  int Lit;
  int i;
  Vec_Int_t *vSupp;
  Acb_Ntk_t *pNtkF_local;
  Vec_Int_t *vDivs_local;
  int local_20;
  int nCoDivs_local;
  int nTargets_local;
  int iTar_local;
  Cnf_Dat_t *pCnf_local;
  
  vSupp = (Vec_Int_t *)pNtkF;
  pNtkF_local = (Acb_Ntk_t *)vDivs;
  vDivs_local._4_4_ = nCoDivs;
  local_20 = nTargets;
  nCoDivs_local = iTar;
  _nTargets_local = pCnf;
  _Lit = (Cnf_Dat_t *)Vec_IntAlloc(100);
  iVar2 = _nTargets_local->nVars - local_20;
  s = sat_solver_new();
  sat_solver_setnvars(s,_nTargets_local->nVars * 2 + vDivs_local._4_4_);
  for (iCoVarBeg = 0; iCoVarBeg < _nTargets_local->nClauses; iCoVarBeg = iCoVarBeg + 1) {
    iVar3 = sat_solver_addclause
                      (s,_nTargets_local->pClauses[iCoVarBeg],
                       _nTargets_local->pClauses[iCoVarBeg + 1]);
    if (iVar3 == 0) {
      return (Vec_Int_t *)0x0;
    }
  }
  iCiVarBeg = Abc_Var2Lit(1,0);
  iVar3 = sat_solver_addclause(s,&iCiVarBeg,&iCoVarBeg);
  if (iVar3 == 0) {
    pCnf_local = (Cnf_Dat_t *)0x0;
  }
  else {
    _nTargets_local->pMan = (Aig_Man_t *)0x0;
    Cnf_DataLift(_nTargets_local,_nTargets_local->nVars);
    for (iCoVarBeg = 0; iCoVarBeg < _nTargets_local->nClauses; iCoVarBeg = iCoVarBeg + 1) {
      iVar3 = sat_solver_addclause
                        (s,_nTargets_local->pClauses[iCoVarBeg],
                         _nTargets_local->pClauses[iCoVarBeg + 1]);
      if (iVar3 == 0) {
        return (Vec_Int_t *)0x0;
      }
    }
    Cnf_DataLift(_nTargets_local,-_nTargets_local->nVars);
    iCiVarBeg = Abc_Var2Lit(_nTargets_local->nVars + 1,0);
    iVar3 = sat_solver_addclause(s,&iCiVarBeg,&iCoVarBeg);
    if (iVar3 == 0) {
      pCnf_local = (Cnf_Dat_t *)0x0;
    }
    else {
      iCiVarBeg = Abc_Var2Lit(iVar2 + nCoDivs_local,1);
      iVar3 = sat_solver_addclause(s,&iCiVarBeg,&iCoVarBeg);
      if (iVar3 == 0) {
        pCnf_local = (Cnf_Dat_t *)0x0;
      }
      else {
        iCiVarBeg = Abc_Var2Lit(iVar2 + _nTargets_local->nVars + nCoDivs_local,0);
        iVar2 = sat_solver_addclause(s,&iCiVarBeg,&iCoVarBeg);
        if (iVar2 == 0) {
          pCnf_local = (Cnf_Dat_t *)0x0;
        }
        else {
          if (0 < vDivs_local._4_4_) {
            aVar6 = Abc_Clock();
            pLits[0] = _nTargets_local->nVars << 1;
            iVar0 = 0;
            Vec_IntClear((Vec_Int_t *)_Lit);
            if (vSuppOld != (Vec_Int_t *)0x0) {
              for (iVar0 = 0; iVar2 = Vec_IntSize(vSuppOld), iVar0 < iVar2; iVar0 = iVar0 + 1) {
                iVar2 = Vec_IntEntry(vSuppOld,iVar0);
                iVar3 = iVar2 + 2 + _nTargets_local->nVars;
                iDivOld = Abc_Var2Lit(iVar2 + 2,0);
                j = Abc_Var2Lit(iVar3,1);
                iVar4 = sat_solver_addclause(s,&iDivOld,pLits);
                if (iVar4 == 0) {
                  printf("Unsat is detected earlier.\n");
                  pLits[1] = -1;
                  break;
                }
                iDivOld = Abc_Var2Lit(iVar2 + 2,1);
                j = Abc_Var2Lit(iVar3,0);
                iVar2 = sat_solver_addclause(s,&iDivOld,pLits);
                if (iVar2 == 0) {
                  printf("Unsat is detected earlier.\n");
                  pLits[1] = -1;
                  break;
                }
              }
            }
            if ((vSuppOld == (Vec_Int_t *)0x0) || (iVar2 = Vec_IntSize(vSuppOld), iVar0 == iVar2)) {
              for (iCoVarBeg = 0; iCoVarBeg < vDivs_local._4_4_; iCoVarBeg = iCoVarBeg + 1) {
                sat_solver_add_xor(s,pLits[0] + iCoVarBeg,iCoVarBeg + 2,
                                   iCoVarBeg + 2 + _nTargets_local->nVars,0);
                pCVar1 = _Lit;
                iVar2 = Abc_Var2Lit(pLits[0] + iCoVarBeg,1);
                Vec_IntPush((Vec_Int_t *)pCVar1,iVar2);
              }
              if (TimeOut != 0) {
                aVar7 = Abc_Clock();
                sat_solver_set_runtime_limit(s,(long)TimeOut * 1000000 + aVar7);
              }
              piVar8 = Vec_IntArray((Vec_Int_t *)_Lit);
              end = Vec_IntLimit((Vec_Int_t *)_Lit);
              pLits[1] = sat_solver_solve(s,piVar8,end,0,0,0,0);
              if (TimeOut != 0) {
                sat_solver_set_runtime_limit(s,0);
              }
              if (pLits[1] == 1) {
                printf("ECO does not exist.\n");
                sat_solver_delete(s);
                Vec_IntFree((Vec_Int_t *)_Lit);
                return (Vec_Int_t *)0x0;
              }
              if (pLits[1] == 0) {
                printf("Support computation timed out after %d sec.\n",(ulong)(uint)TimeOut);
                sat_solver_delete(s);
                Vec_IntFree((Vec_Int_t *)_Lit);
                return (Vec_Int_t *)0x0;
              }
              if (pLits[1] != -1) {
                __assert_fail("status == l_False",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbFunc.c"
                              ,0x4d6,
                              "Vec_Int_t *Acb_DerivePatchSupport(Cnf_Dat_t *, int, int, int, Vec_Int_t *, Acb_Ntk_t *, Vec_Int_t *, int)"
                             );
              }
              printf("Proved that the problem has a solution.  ");
              aVar7 = Abc_Clock();
              Abc_PrintTime(1,"Time",aVar7 - aVar6);
              aVar6 = Abc_Clock();
              piVar8 = Vec_IntArray((Vec_Int_t *)_Lit);
              iVar2 = Vec_IntSize((Vec_Int_t *)_Lit);
              iVar2 = sat_solver_minimize_assumptions(s,piVar8,iVar2,0);
              Vec_IntShrink((Vec_Int_t *)_Lit,iVar2);
              Vec_IntSort((Vec_Int_t *)_Lit,0);
              uVar5 = Vec_IntSize((Vec_Int_t *)_Lit);
              printf("Found one feasible set of %d divisors.  ",(ulong)uVar5);
              aVar7 = Abc_Clock();
              Abc_PrintTime(1,"Time",aVar7 - aVar6);
              iVar2 = Vec_IntSize((Vec_Int_t *)_Lit);
              if (0 < iVar2) {
                aVar6 = Abc_Clock();
                vWeights_00 = Acb_DeriveWeights((Vec_Int_t *)pNtkF_local,(Acb_Ntk_t *)vSupp);
                pCVar1 = _Lit;
                _Lit = (Cnf_Dat_t *)
                       Acb_FindSupport(s,pLits[0],vWeights_00,(Vec_Int_t *)_Lit,TimeOut);
                Vec_IntFree(vWeights_00);
                Vec_IntFree((Vec_Int_t *)pCVar1);
                if (_Lit == (Cnf_Dat_t *)0x0) {
                  printf("Support minimization timed out after %d sec.\n",(ulong)(uint)TimeOut);
                  sat_solver_delete(s);
                  return (Vec_Int_t *)0x0;
                }
                uVar5 = Vec_IntSize((Vec_Int_t *)_Lit);
                printf("Minimized support to %d supp vars.  ",(ulong)uVar5);
                aVar7 = Abc_Clock();
                Abc_PrintTime(1,"Time",aVar7 - aVar6);
              }
              for (iCoVarBeg = 0; iVar2 = iCoVarBeg, iVar3 = Vec_IntSize((Vec_Int_t *)_Lit),
                  iVar2 < iVar3; iCoVarBeg = iCoVarBeg + 1) {
                iVar3 = Vec_IntEntry((Vec_Int_t *)_Lit,iCoVarBeg);
                pCVar1 = _Lit;
                iVar2 = iCoVarBeg;
                iVar3 = Abc_Lit2Var(iVar3);
                Vec_IntWriteEntry((Vec_Int_t *)pCVar1,iVar2,iVar3 - pLits[0]);
              }
              Vec_IntSort((Vec_Int_t *)_Lit,0);
            }
          }
          sat_solver_delete(s);
          if (_Lit != (Cnf_Dat_t *)0x0) {
            Vec_IntSort((Vec_Int_t *)_Lit,0);
          }
          pCnf_local = _Lit;
        }
      }
    }
  }
  return (Vec_Int_t *)pCnf_local;
}

Assistant:

Vec_Int_t * Acb_DerivePatchSupport( Cnf_Dat_t * pCnf, int iTar, int nTargets, int nCoDivs, Vec_Int_t * vDivs, Acb_Ntk_t * pNtkF, Vec_Int_t * vSuppOld, int TimeOut )
{
    Vec_Int_t * vSupp = Vec_IntAlloc( 100 );
    int i, Lit;
    int iCoVarBeg = 1;
    int iCiVarBeg = pCnf->nVars - nTargets;
    sat_solver * pSat = sat_solver_new();
    sat_solver_setnvars( pSat, 2 * pCnf->nVars + nCoDivs );
    // add clauses
    for ( i = 0; i < pCnf->nClauses; i++ )
        if ( !sat_solver_addclause( pSat, pCnf->pClauses[i], pCnf->pClauses[i+1] ) )
            return NULL;
    // add output clause
    Lit = Abc_Var2Lit( iCoVarBeg, 0 );
    if ( !sat_solver_addclause( pSat, &Lit, &Lit+1 ) )
        return NULL;
    // add clauses
    pCnf->pMan = NULL;
    Cnf_DataLift( pCnf, pCnf->nVars );
    for ( i = 0; i < pCnf->nClauses; i++ )
        if ( !sat_solver_addclause( pSat, pCnf->pClauses[i], pCnf->pClauses[i+1] ) )
            return NULL;
    Cnf_DataLift( pCnf, -pCnf->nVars );
    // add output clause
    Lit = Abc_Var2Lit( iCoVarBeg+pCnf->nVars, 0 );
    if ( !sat_solver_addclause( pSat, &Lit, &Lit+1 ) )
        return NULL;
    // create XORs for targets
    // add negative literal
    Lit = Abc_Var2Lit( iCiVarBeg + iTar, 1 );
    if ( !sat_solver_addclause( pSat, &Lit, &Lit+1 ) )
        return NULL;
    // add positive literal
    Lit = Abc_Var2Lit( iCiVarBeg+pCnf->nVars + iTar, 0 );
    if ( !sat_solver_addclause( pSat, &Lit, &Lit+1 ) )
        return NULL;
    // create XORs for divisors
    if ( nCoDivs > 0 )
    {
        abctime clk = Abc_Clock();
        int fUseMinAssump = 1;
        int iLit, nSuppNew, status;
        int iDivVar = 2 * pCnf->nVars;
        int pLits[2];
        int j = 0, iDivOld;
        Vec_IntClear( vSupp );
        if ( vSuppOld )
        {
            // start with predefined support
            Vec_IntForEachEntry( vSuppOld, iDivOld, j )
            {
                int iVar0 = iCoVarBeg+1+iDivOld;
                int iVar1 = iCoVarBeg+1+iDivOld+pCnf->nVars;
                //printf( "Selecting predefined divisor %d with weight %d\n", 
                //    iDivOld, Vec_IntEntry(&pNtkF->vObjWeight, Vec_IntEntry(vDivs, iDivOld)) );
                // add equality clauses
                pLits[0] = Abc_Var2Lit( iVar0, 0 );
                pLits[1] = Abc_Var2Lit( iVar1, 1 );
                if ( !sat_solver_addclause( pSat, pLits, pLits+2 ) )
                {
                    printf( "Unsat is detected earlier.\n" );
                    status = l_False;
                    break;
                }
                pLits[0] = Abc_Var2Lit( iVar0, 1 );
                pLits[1] = Abc_Var2Lit( iVar1, 0 );
                if ( !sat_solver_addclause( pSat, pLits, pLits+2 ) )
                {
                    printf( "Unsat is detected earlier.\n" );
                    status = l_False;
                    break;
                }
            }
        }
        if ( vSuppOld == NULL || j == Vec_IntSize(vSuppOld) )
        {
            for ( i = 0; i < nCoDivs; i++ )
            {
                sat_solver_add_xor( pSat, iDivVar+i, iCoVarBeg+1+i, iCoVarBeg+1+i+pCnf->nVars, 0 );
                Vec_IntPush( vSupp, Abc_Var2Lit(iDivVar+i, 1) );
            }
            // try one run
            if ( TimeOut ) sat_solver_set_runtime_limit( pSat, TimeOut * CLOCKS_PER_SEC + Abc_Clock() );
            status = sat_solver_solve( pSat, Vec_IntArray(vSupp), Vec_IntLimit(vSupp), 0, 0, 0, 0 );
            if ( TimeOut ) sat_solver_set_runtime_limit( pSat, 0 );
            if ( status == l_True )
            {
                printf( "ECO does not exist.\n" );
                sat_solver_delete( pSat );
                Vec_IntFree( vSupp );
                return NULL;
            }
            if ( status == l_Undef )
            {
                printf( "Support computation timed out after %d sec.\n", TimeOut );
                sat_solver_delete( pSat );
                Vec_IntFree( vSupp );
                return NULL;
            }
            assert( status == l_False );
            printf( "Proved that the problem has a solution.  " );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
            // find minimum subset
            if ( fUseMinAssump )
            {
                // solve in a standard way
                abctime clk = Abc_Clock();
                nSuppNew = sat_solver_minimize_assumptions( pSat, Vec_IntArray(vSupp), Vec_IntSize(vSupp), 0 );
                Vec_IntShrink( vSupp, nSuppNew );
                Vec_IntSort( vSupp, 0 );
                printf( "Found one feasible set of %d divisors.  ", Vec_IntSize(vSupp) );
                Abc_PrintTime( 1, "Time", Abc_Clock() - clk );

                // perform minimization
                if ( Vec_IntSize(vSupp) > 0 )
                {
                    abctime clk = Abc_Clock();
                    Vec_Int_t * vTemp, * vWeights = Acb_DeriveWeights( vDivs, pNtkF );
                    vSupp = Acb_FindSupport( pSat, iDivVar, vWeights, vTemp = vSupp, TimeOut );
                    Vec_IntFree( vWeights );
                    Vec_IntFree( vTemp );
                    if ( vSupp == NULL )
                    {
                        printf( "Support minimization timed out after %d sec.\n", TimeOut );
                        sat_solver_delete( pSat );
                        return NULL;
                    }
                    printf( "Minimized support to %d supp vars.  ", Vec_IntSize(vSupp) );
                    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
                }
            }
            else
            {
                int * pFinal, nFinal = sat_solver_final( pSat, &pFinal );
                printf( "AnalyzeFinal returned %d (out of %d).\n", nFinal, Vec_IntSize(vSupp) );
                Vec_IntClear( vSupp ); 
                for ( i = 0; i < nFinal; i++ )
                    Vec_IntPush( vSupp, Abc_LitNot(pFinal[i]) );
                // try one run
                status = sat_solver_solve( pSat, Vec_IntArray(vSupp), Vec_IntLimit(vSupp), 0, 0, 0, 0 );
                assert( status == l_False );
                // try again
                nFinal = sat_solver_final( pSat, &pFinal );
                printf( "AnalyzeFinal returned %d (out of %d).\n", nFinal, Vec_IntSize(vSupp) );
            }
            // remap them into numbers
            Vec_IntForEachEntry( vSupp, iLit, i )
                Vec_IntWriteEntry( vSupp, i, Abc_Lit2Var(iLit)-iDivVar );
            Vec_IntSort( vSupp, 0 );
        }
    }
    sat_solver_delete( pSat );
    if ( vSupp ) Vec_IntSort( vSupp, 0 );
    return vSupp;
}